

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
     ::match(matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>_> *candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
            *matchers)

{
  matched_t<wasm::Match::Internal::AnyKind<bool>_> *pmVar1;
  int32_t iVar2;
  Literal local_58;
  Literal local_40;
  GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0> local_21;
  
  Literal::Literal(&local_40,candidate);
  iVar2 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0>::operator()
                    (&local_21,&local_40);
  pmVar1 = (matchers->curr).binder;
  if (pmVar1 != (matched_t<wasm::Match::Internal::AnyKind<bool>_> *)0x0) {
    *pmVar1 = iVar2 != 0;
  }
  Literal::Literal(&local_58,candidate);
  Literal::~Literal(&local_58);
  Literal::~Literal(&local_40);
  return true;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }